

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_event_listener.cpp
# Opt level: O3

void HawkTracer::parser::print_event(Event *event,size_t indent)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  size_t sVar3;
  char cVar4;
  _Hash_node_base *p_Var5;
  char *local_80;
  long local_78;
  char local_70 [16];
  size_t local_60;
  char *local_58;
  long local_50;
  char local_48 [16];
  size_t local_38;
  
  p_Var5 = (event->_values)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    local_38 = indent + 2;
    local_60 = indent;
    do {
      local_80 = local_70;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_60);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_80,local_78);
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      p_Var1 = p_Var5[6]._M_nxt[4]._M_nxt;
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,p_Var1,
                 (long)&p_Var1->_M_nxt + (long)&(p_Var5[6]._M_nxt[5]._M_nxt)->_M_nxt);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_80,local_78);
      local_58 = (char *)CONCAT71(local_58._1_7_,0x20);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
      local_58 = local_48;
      p_Var1 = (p_Var5[6]._M_nxt)->_M_nxt;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,p_Var1,
                 (long)&p_Var1->_M_nxt + (long)&(p_Var5[6]._M_nxt[1]._M_nxt)->_M_nxt);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      switch(*(undefined4 *)&p_Var5[6]._M_nxt[10]._M_nxt) {
      case 0:
      case 1:
        local_80 = (char *)CONCAT71(local_80._1_7_,*(undefined1 *)&p_Var5[5]._M_nxt);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_80,1);
        break;
      case 2:
        goto LAB_0010c031;
      case 3:
        poVar2 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,*(short *)&p_Var5[5]._M_nxt);
        break;
      case 4:
        goto LAB_0010c031;
      case 5:
        poVar2 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var5[5]._M_nxt);
        break;
      case 6:
LAB_0010c031:
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        break;
      case 7:
        poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
        break;
      case 8:
        poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
        break;
      case 9:
        p_Var1 = p_Var5[5]._M_nxt;
        if (p_Var1 == (_Hash_node_base *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x118190);
        }
        else {
          sVar3 = strlen((char *)p_Var1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)p_Var1,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        cVar4 = -0x70;
        goto LAB_0010c09e;
      case 10:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        print_event((Event *)p_Var5[5]._M_nxt,local_38);
        goto LAB_0010c0ab;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/debug_event_listener.cpp"
                      ,0x1b,"void HawkTracer::parser::print_field_value(const Event::Value &)");
      }
      cVar4 = (char)poVar2;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
LAB_0010c09e:
      std::ostream::put(cVar4);
      std::ostream::flush();
LAB_0010c0ab:
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

static void print_event(const Event& event, size_t indent)
{
    for (const auto& value : event.get_values())
    {
        std::cout << std::string(indent, ' ');
        std::cout << value.second.field->get_type_name() << ' ' << value.second.field->get_name() << ": ";
        
        if (value.second.field->get_type_id() == FieldTypeId::STRUCT)
        {
            std::cout << std::endl;
            print_event(*value.second.value.f_EVENT, indent + 2);
        }
        else
        {
            print_field_value(value.second);
        }
    }
}